

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O3

CompressedIDManifest * __thiscall
Imf_3_4::CompressedIDManifest::operator=(CompressedIDManifest *this,CompressedIDManifest *other)

{
  int iVar1;
  uchar *__dest;
  
  if (this != other) {
    if (this->_data != (uchar *)0x0) {
      free(this->_data);
    }
    iVar1 = other->_compressedDataSize;
    __dest = (uchar *)malloc((long)iVar1);
    this->_data = __dest;
    this->_compressedDataSize = iVar1;
    this->_uncompressedDataSize = other->_uncompressedDataSize;
    memcpy(__dest,other->_data,(long)iVar1);
  }
  return this;
}

Assistant:

CompressedIDManifest&
CompressedIDManifest::operator= (const CompressedIDManifest& other)
{
    if (this != &other)
    {
        if (_data) { free (_data); }
        _data = (unsigned char*) malloc (other._compressedDataSize);
        _compressedDataSize   = other._compressedDataSize;
        _uncompressedDataSize = other._uncompressedDataSize;
        memcpy (_data, other._data, _compressedDataSize);
    }
    return *this;
}